

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateSerializedSizeCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  char *text;
  
  if ((*(int *)(this->descriptor_ + 0x4c) == 2) &&
     (((this->super_FieldGenerator).params_)->generate_has_ != true)) {
    text = 
    "size += com.google.protobuf.nano.CodedOutputByteBufferNano\n    .compute$capitalized_type$Size($number$, this.$name$);\n"
    ;
  }
  else {
    GenerateSerializationConditional(this,printer);
    text = 
    "  size += com.google.protobuf.nano.CodedOutputByteBufferNano\n      .compute$capitalized_type$Size($number$, this.$name$);\n}\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  if (descriptor_->is_required() && !params_.generate_has()) {
    printer->Print(variables_,
      "size += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
      "    .compute$capitalized_type$Size($number$, this.$name$);\n");
  } else {
    GenerateSerializationConditional(printer);
    printer->Print(variables_,
      "  size += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
      "      .compute$capitalized_type$Size($number$, this.$name$);\n"
      "}\n");
  }
}